

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

void duckdb::PrepareSortKeys
               (DataChunk *input,
               unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
               *sort_keys,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *column_ids)

{
  _Hash_node_base *p_Var1;
  idx_t input_count;
  Vector *pVVar2;
  default_delete<duckdb::Vector> *this;
  reference input_00;
  Vector *pVVar3;
  type result;
  pointer *__ptr;
  Vector *local_58;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  LogicalType local_48;
  
  local_50 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)sort_keys;
  for (p_Var1 = (column_ids->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    this = (default_delete<duckdb::Vector> *)
           ::std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)sort_keys,(key_type *)(p_Var1 + 1));
    if (*(long *)this == 0) {
      input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,(size_type)p_Var1[1]._M_nxt);
      pVVar3 = (Vector *)operator_new(0x68);
      LogicalType::LogicalType(&local_48,BLOB);
      Vector::Vector(pVVar3,&local_48,0x800);
      local_58 = pVVar3;
      LogicalType::~LogicalType(&local_48);
      pVVar2 = local_58;
      local_58 = (Vector *)0x0;
      pVVar3 = *(Vector **)this;
      *(Vector **)this = pVVar2;
      if (pVVar3 != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()(this,pVVar3);
      }
      if (local_58 != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()
                  ((default_delete<duckdb::Vector> *)&local_58,local_58);
      }
      input_count = input->count;
      result = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          this);
      CreateSortKeyHelpers::CreateSortKey(input_00,input_count,(OrderModifiers)0x302,result);
      sort_keys = (unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                   *)local_50;
    }
  }
  return;
}

Assistant:

static void PrepareSortKeys(DataChunk &input, unordered_map<column_t, unique_ptr<Vector>> &sort_keys,
                            const unordered_set<column_t> &column_ids) {
	OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
	for (auto &it : column_ids) {
		auto &sort_key = sort_keys[it];
		if (sort_key != nullptr) {
			continue;
		}
		auto &column = input.data[it];
		sort_key = make_uniq<Vector>(LogicalType::BLOB);
		CreateSortKeyHelpers::CreateSortKey(column, input.size(), order_modifiers, *sort_key);
	}
}